

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Relay.cpp
# Opt level: O0

int __thiscall
RenX_RelayPlugin::send_downstream
          (RenX_RelayPlugin *this,Server *in_server,string_view in_message,
          upstream_server_info *in_server_info)

{
  bool bVar1;
  _Ios_Openmode _Var2;
  int iVar3;
  ostream *poVar4;
  char *pcVar5;
  basic_ostream<char,_std::char_traits<char>_> *this_00;
  string local_250;
  long local_230;
  ofstream log_file;
  upstream_server_info *in_server_info_local;
  Server *in_server_local;
  RenX_RelayPlugin *this_local;
  string_view in_message_local;
  
  if ((in_server_info->m_settings->m_log_traffic & 1U) != 0) {
    get_log_filename_abi_cxx11_(&local_250,this,in_server,in_server_info);
    _Var2 = std::operator|(_S_out,_S_app);
    _Var2 = std::operator|(_Var2,_S_bin);
    std::ofstream::ofstream(&local_230,(string *)&local_250,_Var2);
    std::__cxx11::string::~string((string *)&local_250);
    bVar1 = std::ios::operator_cast_to_bool
                      ((ios *)((long)&local_230 + *(long *)(local_230 + -0x18)));
    if (bVar1) {
      poVar4 = std::operator<<((ostream *)&local_230,'[');
      pcVar5 = (char *)getTimeFormat("%H:%M:%S");
      poVar4 = std::operator<<(poVar4,pcVar5);
      poVar4 = std::operator<<(poVar4,"] (");
      poVar4 = std::operator<<(poVar4,(string *)in_server_info->m_settings);
      poVar4 = std::operator<<(poVar4," -> RenX::Server): ");
      this_00 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)poVar4,in_message);
      std::ostream::operator<<((ostream *)this_00,std::endl<char,std::char_traits<char>>);
    }
    std::ofstream::~ofstream(&local_230);
  }
  iVar3 = RenX::Server::sendData(in_server,in_message._M_len,in_message._M_str);
  return iVar3;
}

Assistant:

int RenX_RelayPlugin::send_downstream(RenX::Server& in_server, std::string_view in_message, upstream_server_info& in_server_info) {
	if (in_server_info.m_settings->m_log_traffic) {
		std::ofstream log_file{ get_log_filename(in_server, in_server_info), std::ios::out | std::ios::app | std::ios::binary };
		if (log_file) {
			log_file << '[' << getTimeFormat("%H:%M:%S") << "] (" << in_server_info.m_settings->m_label << " -> RenX::Server): " << in_message << std::endl;
		}
	}

	return in_server.sendData(in_message);
}